

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

void ggml_numa_init(ggml_numa_strategy numa_flag)

{
  int iVar1;
  pthread_t __th;
  FILE *__stream;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint current_cpu;
  char buf [42];
  stat st;
  char path [256];
  undefined1 local_1fc [4];
  char local_1f8 [2];
  char cStack_1f6;
  stat local_1c8;
  cpu_set_t local_138 [2];
  
  if (g_state.numa.n_nodes == 0) {
    g_state.numa.numa_strategy = numa_flag;
    __th = pthread_self();
    local_138[0].__bits[0] = 0;
    local_138[0].__bits[1] = 0;
    local_138[0].__bits[2] = 0;
    local_138[0].__bits[3] = 0;
    local_138[0].__bits[4] = 0;
    local_138[0].__bits[5] = 0;
    local_138[0].__bits[6] = 0;
    local_138[0].__bits[7] = 0;
    local_138[0].__bits[8] = 0;
    local_138[0].__bits[9] = 0;
    local_138[0].__bits[10] = 0;
    local_138[0].__bits[0xb] = 0;
    local_138[0].__bits[0xc] = 0;
    local_138[0].__bits[0xd] = 0;
    local_138[0].__bits[0xe] = 0;
    local_138[0].__bits[0xf] = 0;
    pthread_getaffinity_np(__th,0x80,local_138);
    g_state.numa.cpuset.__bits[0] = local_138[0].__bits[0];
    g_state.numa.cpuset.__bits[1] = local_138[0].__bits[1];
    g_state.numa.cpuset.__bits[2] = local_138[0].__bits[2];
    g_state.numa.cpuset.__bits[3] = local_138[0].__bits[3];
    g_state.numa.cpuset.__bits[4] = local_138[0].__bits[4];
    g_state.numa.cpuset.__bits[5] = local_138[0].__bits[5];
    g_state.numa.cpuset.__bits[6] = local_138[0].__bits[6];
    g_state.numa.cpuset.__bits[7] = local_138[0].__bits[7];
    g_state.numa.cpuset.__bits[8] = local_138[0].__bits[8];
    g_state.numa.cpuset.__bits[9] = local_138[0].__bits[9];
    g_state.numa.cpuset.__bits[10] = local_138[0].__bits[10];
    g_state.numa.cpuset.__bits[0xb] = local_138[0].__bits[0xb];
    g_state.numa.cpuset.__bits[0xc] = local_138[0].__bits[0xc];
    g_state.numa.cpuset.__bits[0xd] = local_138[0].__bits[0xd];
    g_state.numa.cpuset.__bits[0xe] = local_138[0].__bits[0xe];
    g_state.numa.cpuset.__bits[0xf] = local_138[0].__bits[0xf];
    if (g_state.numa.n_nodes < 8) {
      do {
        iVar1 = snprintf((char *)local_138,0x100,"/sys/devices/system/node/node%u");
        if (0xfe < iVar1 - 1U) {
          uVar5 = 0x25c;
          goto LAB_0010be3f;
        }
        iVar1 = stat((char *)local_138,&local_1c8);
        if (iVar1 != 0) break;
        g_state.numa.n_nodes = g_state.numa.n_nodes + 1;
      } while (g_state.numa.n_nodes < 8);
    }
    if (g_state.numa.total_cpus < 0x200) {
      do {
        iVar1 = snprintf((char *)local_138,0x100,"/sys/devices/system/cpu/cpu%u");
        if (0xfe < iVar1 - 1U) {
          uVar5 = 0x264;
LAB_0010be3f:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                     ,uVar5,"GGML_ASSERT(%s) failed","rv > 0 && (unsigned)rv < sizeof(path)");
        }
        iVar1 = stat((char *)local_138,&local_1c8);
        if (iVar1 != 0) break;
        g_state.numa.total_cpus = g_state.numa.total_cpus + 1;
      } while (g_state.numa.total_cpus < 0x200);
    }
    iVar1 = getcpu(local_1fc,0x162a04);
    if (((g_state.numa.n_nodes == 0) || (g_state.numa.total_cpus == 0)) || (iVar1 != 0)) {
      g_state.numa.n_nodes = 0;
    }
    else if (g_state.numa.n_nodes != 0) {
      uVar6 = 0;
      do {
        g_state.numa.nodes[uVar6].n_cpus = 0;
        if (g_state.numa.total_cpus != 0) {
          uVar4 = 0;
          do {
            iVar1 = snprintf((char *)local_138,0x100,"/sys/devices/system/node/node%u/cpu%u",
                             uVar6 & 0xffffffff,uVar4);
            if (0xfe < iVar1 - 1U) {
              uVar5 = 0x285;
              goto LAB_0010be3f;
            }
            iVar1 = stat((char *)local_138,&local_1c8);
            if (iVar1 == 0) {
              uVar3 = g_state.numa.nodes[uVar6].n_cpus;
              g_state.numa.nodes[uVar6].n_cpus = uVar3 + 1;
              *(int *)(uVar6 * 0x804 + 0x15e9dc + (ulong)uVar3 * 4) = (int)uVar4;
            }
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while (uVar3 < g_state.numa.total_cpus);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < g_state.numa.n_nodes);
      if (1 < g_state.numa.n_nodes) {
        __stream = fopen("/proc/sys/kernel/numa_balancing","r");
        if (__stream != (FILE *)0x0) {
          pcVar2 = fgets(local_1f8,0x2a,__stream);
          if ((pcVar2 != (char *)0x0) && (cStack_1f6 != '\0' || (short)_local_1f8 != 0xa30)) {
            ggml_log_internal(3,
                              "/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n"
                             );
          }
          fclose(__stream);
        }
      }
    }
  }
  else {
    ggml_numa_init_cold_1();
  }
  return;
}

Assistant:

void ggml_numa_init(enum ggml_numa_strategy numa_flag) {
    if (g_state.numa.n_nodes > 0) {
        fprintf(stderr, "ggml_numa_init: NUMA already initialized\n");

        return;
    }

#if defined(__gnu_linux__)
    struct stat st;
    char path[256];
    int rv;

    // set numa scheme
    g_state.numa.numa_strategy = numa_flag;

    GGML_PRINT_DEBUG("numa strategy %u\n",g_state.numa.numa_strategy);

    g_state.numa.cpuset = ggml_get_numa_affinity();

    // enumerate nodes
    while (g_state.numa.n_nodes < GGML_NUMA_MAX_NODES) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u", g_state.numa.n_nodes);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.n_nodes;
    }

    // enumerate CPUs
    while (g_state.numa.total_cpus < GGML_NUMA_MAX_CPUS) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/cpu/cpu%u", g_state.numa.total_cpus);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.total_cpus;
    }

    GGML_PRINT_DEBUG("found %u numa nodes, %u CPUs\n", g_state.numa.n_nodes, g_state.numa.total_cpus);

    // figure out which node we're on
    uint current_cpu;
    int getcpu_ret = 0;
#if __GLIBC__ > 2 || (__GLIBC__ == 2 && __GLIBC_MINOR__ > 33) || defined(__COSMOPOLITAN__)
    getcpu_ret = getcpu(&current_cpu, &g_state.numa.current_node);
#else
    // old glibc doesn't have a wrapper for this call. Fall back on direct syscall
#   if !defined(SYS_getcpu) && defined(SYS_get_cpu)
#       define SYS_getcpu SYS_get_cpu // some older glibc versions use this name
#   endif
    getcpu_ret = syscall(SYS_getcpu, &current_cpu, &g_state.numa.current_node);
#endif

    if (g_state.numa.n_nodes < 1 || g_state.numa.total_cpus < 1 || getcpu_ret != 0) {
        g_state.numa.n_nodes = 0;
        return;
    }

    GGML_PRINT_DEBUG("found our process on numa node %u, CPU %u\n", g_state.numa.current_node, current_cpu);

    for (uint32_t n = 0; n < g_state.numa.n_nodes; ++n) {
        struct ggml_numa_node * node = &g_state.numa.nodes[n];
        GGML_PRINT_DEBUG("CPUs on node %u:", n);
        node->n_cpus = 0;
        for (uint32_t c = 0; c < g_state.numa.total_cpus; ++c) {
            rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u/cpu%u", n, c);
            GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
            if (stat(path, &st) == 0) {
                node->cpus[node->n_cpus++] = c;
                GGML_PRINT_DEBUG(" %u", c);
            }
        }
        GGML_PRINT_DEBUG("\n");
    }

    if (ggml_is_numa()) {
        FILE *fptr = fopen("/proc/sys/kernel/numa_balancing", "r");
        if (fptr != NULL) {
            char buf[42];
            if (fgets(buf, sizeof(buf), fptr) && strncmp(buf, "0\n", sizeof(buf)) != 0) {
                GGML_LOG_WARN("/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n");
            }
            fclose(fptr);
        }
    }
#else
    UNUSED(numa_flag);
    // TODO
#endif
}